

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yoml-parser.h
# Opt level: O2

int yoml__resolve_merge(yoml_t **target,yaml_parser_t *parser,yoml_parse_args_t *parse_args)

{
  yoml_type_t yVar1;
  yoml_t *pyVar2;
  yoml_t_conflict *node;
  yoml_t_conflict *src;
  int iVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  size_t offset;
  yoml_t **target_00;
  
  yVar1 = (*target)->type;
  iVar3 = 0;
  if (yVar1 == YOML_TYPE_SEQUENCE) {
    lVar5 = 0x40;
    pcVar4 = (char *)0xffffffffffffffff;
    do {
      pcVar4 = pcVar4 + 1;
      if (pcVar4 == ((*target)->data).scalar) goto LAB_0018a652;
      target_00 = (yoml_t **)((long)&(*target)->type + lVar5);
      lVar5 = lVar5 + 8;
      iVar3 = yoml__resolve_merge(target_00,parser,parse_args);
    } while (iVar3 == 0);
    iVar3 = -1;
  }
  else if (yVar1 == YOML_TYPE_MAPPING) {
    sVar6 = ((*target)->data).sequence.size;
    if (sVar6 != 0) {
      do {
        offset = sVar6 - 1;
        lVar5 = sVar6 * 0x10;
        iVar3 = yoml__resolve_merge((yoml_t **)(&(*target)->_refcnt + sVar6 * 2),parser,parse_args);
        if ((iVar3 != 0) ||
           (iVar3 = yoml__resolve_merge((yoml_t **)((long)&(*target)->data + lVar5),parser,
                                        parse_args), iVar3 != 0)) {
          return -1;
        }
        pyVar2 = *target;
        node = (yoml_t_conflict *)(&pyVar2->_refcnt)[sVar6 * 2];
        if ((((node->type == YOML_TYPE_SCALAR) && (pcVar4 = (node->data).scalar, *pcVar4 == '<')) &&
            (pcVar4[1] == '<')) && (pcVar4[2] == '\0')) {
          src = *(yoml_t_conflict **)((long)&pyVar2->data + lVar5);
          memmove(&pyVar2->_refcnt + sVar6 * 2,(void *)((long)&pyVar2->data + lVar5 + 8),
                  ((long)(pyVar2->data).scalar - sVar6) * 0x10);
          ((*target)->data).scalar = (char *)(((*target)->data).sequence.size - 1);
          if (src->type == YOML_TYPE_SEQUENCE) {
            pcVar4 = (char *)0x0;
            while (pcVar4 != (src->data).scalar) {
              iVar3 = yoml__merge(target,offset,
                                  *(yoml_t_conflict **)((long)&src->data + (long)pcVar4 * 8 + 8));
              pcVar4 = pcVar4 + 1;
              if (iVar3 != 0) goto LAB_0018a687;
            }
          }
          else {
            iVar3 = yoml__merge(target,offset,src);
            if (iVar3 != 0) {
LAB_0018a687:
              if (parser == (yaml_parser_t *)0x0) {
                return -1;
              }
              parser->problem = "value of the merge key MUST be a mapping or a sequence of mappings"
              ;
              sVar6 = node->column;
              (parser->problem_mark).line = node->line;
              (parser->problem_mark).column = sVar6;
              return -1;
            }
          }
          yoml_free(node,parse_args->mem_set);
          yoml_free(src,parse_args->mem_set);
        }
        sVar6 = offset;
      } while (offset != 0);
LAB_0018a652:
      iVar3 = 0;
    }
  }
  else if (yVar1 == YOML__TYPE_UNRESOLVED_ALIAS) {
    __assert_fail("!\"unreachable\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/yoml/yoml-parser.h"
                  ,0x10c,"int yoml__resolve_merge(yoml_t **, yaml_parser_t *, yoml_parse_args_t *)")
    ;
  }
  return iVar3;
}

Assistant:

static inline int yoml__resolve_merge(yoml_t **target, yaml_parser_t *parser, yoml_parse_args_t *parse_args)
{
    size_t i, j;

    switch ((*target)->type) {
    case YOML_TYPE_SCALAR:
        break;
    case YOML_TYPE_SEQUENCE:
        for (i = 0; i != (*target)->data.sequence.size; ++i) {
            if (yoml__resolve_merge((*target)->data.sequence.elements + i, parser, parse_args) != 0)
                return -1;
        }
        break;
    case YOML_TYPE_MAPPING:
        if ((*target)->data.mapping.size != 0) {
            i = (*target)->data.mapping.size;
            do {
                --i;
                if (yoml__resolve_merge(&(*target)->data.mapping.elements[i].key, parser, parse_args) != 0)
                    return -1;
                if (yoml__resolve_merge(&(*target)->data.mapping.elements[i].value, parser, parse_args) != 0)
                    return -1;
                if ((*target)->data.mapping.elements[i].key->type == YOML_TYPE_SCALAR &&
                    strcmp((*target)->data.mapping.elements[i].key->data.scalar, "<<") == 0) {
                    /* erase the slot (as well as preserving the values) */
                    yoml_mapping_element_t src = (*target)->data.mapping.elements[i];
                    memmove((*target)->data.mapping.elements + i, (*target)->data.mapping.elements + i + 1,
                            ((*target)->data.mapping.size - i - 1) * sizeof((*target)->data.mapping.elements[0]));
                    --(*target)->data.mapping.size;
                    /* merge */
                    if (src.value->type == YOML_TYPE_SEQUENCE) {
                        for (j = 0; j != src.value->data.sequence.size; ++j)
                            if (yoml__merge(target, i, src.value->data.sequence.elements[j]) != 0) {
                            MergeError:
                                if (parser != NULL) {
                                    parser->problem = "value of the merge key MUST be a mapping or a sequence of mappings";
                                    parser->problem_mark.line = src.key->line;
                                    parser->problem_mark.column = src.key->column;
                                }
                                return -1;
                            }
                    } else {
                        if (yoml__merge(target, i, src.value) != 0)
                            goto MergeError;
                    }
                    /* cleanup */
                    yoml_free(src.key, parse_args->mem_set);
                    yoml_free(src.value, parse_args->mem_set);
                }
            } while (i != 0);
        }
        break;
    case YOML__TYPE_UNRESOLVED_ALIAS:
        assert(!"unreachable");
        break;
    }

    return 0;
}